

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::Coap::RequestsCache::Eliminate
          (RequestsCache *this,RequestHolder *aRequestHolder)

{
  bool bVar1;
  pointer __a;
  _Self local_28;
  _Self local_20;
  iterator holder;
  RequestHolder *aRequestHolder_local;
  RequestsCache *this_local;
  
  holder._M_node = (_Base_ptr)aRequestHolder;
  local_20._M_node =
       (_Base_ptr)
       std::
       multiset<ot::commissioner::coap::Coap::RequestHolder,_std::less<ot::commissioner::coap::Coap::RequestHolder>,_std::allocator<ot::commissioner::coap::Coap::RequestHolder>_>
       ::begin(&this->mContainer);
  do {
    local_28._M_node =
         (_Base_ptr)
         std::
         multiset<ot::commissioner::coap::Coap::RequestHolder,_std::less<ot::commissioner::coap::Coap::RequestHolder>,_std::allocator<ot::commissioner::coap::Coap::RequestHolder>_>
         ::end(&this->mContainer);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) {
LAB_00318d39:
      UpdateTimer(this);
      return;
    }
    __a = std::_Rb_tree_const_iterator<ot::commissioner::coap::Coap::RequestHolder>::operator->
                    (&local_20);
    bVar1 = std::operator==(&__a->mRequest,
                            (shared_ptr<ot::commissioner::coap::Message> *)holder._M_node);
    if (bVar1) {
      std::
      multiset<ot::commissioner::coap::Coap::RequestHolder,std::less<ot::commissioner::coap::Coap::RequestHolder>,std::allocator<ot::commissioner::coap::Coap::RequestHolder>>
      ::erase_abi_cxx11_((multiset<ot::commissioner::coap::Coap::RequestHolder,std::less<ot::commissioner::coap::Coap::RequestHolder>,std::allocator<ot::commissioner::coap::Coap::RequestHolder>>
                          *)&this->mContainer,(const_iterator)local_20._M_node);
      goto LAB_00318d39;
    }
    std::_Rb_tree_const_iterator<ot::commissioner::coap::Coap::RequestHolder>::operator++(&local_20)
    ;
  } while( true );
}

Assistant:

void Coap::RequestsCache::Eliminate(const RequestHolder &aRequestHolder)
{
    for (auto holder = mContainer.begin(); holder != mContainer.end(); ++holder)
    {
        if (holder->mRequest == aRequestHolder.mRequest)
        {
            mContainer.erase(holder);
            break;
        }
    }

    UpdateTimer();
}